

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
* get_1d_sincos_pos_embed_from_grid_new
            (vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
             *__return_storage_ptr__,int embed_dim,
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *pos)

{
  pointer pvVar1;
  ulong __n;
  ulong uVar2;
  int w;
  int iVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  allocator_type local_9b;
  allocator_type local_9a;
  allocator_type local_99;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_80;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_78;
  vector<float,_std::allocator<float>_> omega;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  pvVar1 = (pos->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(pos->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  uVar4 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data) >> 2;
  __n = (ulong)((uint)embed_dim >> 1);
  local_80 = pos;
  std::vector<float,_std::allocator<float>_>::vector(&omega,__n,(allocator_type *)&local_78);
  for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
    dVar10 = pow(10000.0,(double)((float)(int)uVar5 / (float)((uint)embed_dim >> 1)));
    omega.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar5] = (float)(1.0 / dVar10);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,(ulong)(uint)embed_dim,&local_99);
  iVar3 = (int)uVar4;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_78,(long)iVar3,(value_type *)&local_48,&local_9a);
  iVar7 = (int)uVar2;
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar7,&local_78,&local_9b);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_78);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  uVar5 = 0;
  local_88 = uVar4 & 0xffffffff;
  if (iVar3 < 1) {
    local_88 = uVar5;
  }
  local_98 = uVar2 & 0xffffffff;
  if (iVar7 < 1) {
    local_98 = uVar5;
  }
  while (uVar5 != local_98) {
    local_90 = uVar5;
    for (uVar2 = 0; uVar2 != local_88; uVar2 = uVar2 + 1) {
      for (lVar6 = 0; __n * 4 - lVar6 != 0; lVar6 = lVar6 + 4) {
        fVar8 = *(float *)(*(long *)&(local_80->
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data + uVar2 * 4) *
                *(float *)((long)omega.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar6);
        fVar9 = sinf(fVar8);
        *(float *)(*(long *)(*(long *)&(__return_storage_ptr__->
                                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data + uVar2 * 0x18) + lVar6) =
             fVar9;
        fVar8 = cosf(fVar8);
        *(float *)(lVar6 + *(long *)(*(long *)&(__return_storage_ptr__->
                                               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar2 * 0x18) +
                           __n * 4) = fVar8;
      }
    }
    uVar5 = local_90 + 1;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&omega.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<std::vector<float>>> get_1d_sincos_pos_embed_from_grid_new(int embed_dim, const std::vector<std::vector<float>> & pos) {
    assert(embed_dim % 2 == 0);
    int H = pos.size();
    int W = pos[0].size();

    std::vector<float> omega(embed_dim / 2);
    for (int i = 0; i < embed_dim / 2; ++i) {
        omega[i] = 1.0 / pow(10000.0, static_cast<float>(i) / (embed_dim / 2));
    }

    std::vector<std::vector<std::vector<float>>> emb(H, std::vector<std::vector<float>>(W, std::vector<float>(embed_dim)));
    for (int h = 0; h < H; ++h) {
        for (int w = 0; w < W; ++w) {
            for (int d = 0; d < embed_dim / 2; ++d) {
                float out_value = pos[h][w] * omega[d];
                emb[h][w][d] = sin(out_value);
                emb[h][w][d + embed_dim / 2] = cos(out_value);
            }
        }
    }

    return emb;
}